

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall
CholeskyFactor::eliminate
          (CholeskyFactor *this,vector<double,_std::allocator<double>_> *m,HighsInt i,HighsInt j,
          HighsInt kmax,HighsInt currentk)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  iVar5 = j * kmax;
  pdVar4 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar4[iVar5 + i];
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  iVar6 = kmax * i;
  dVar9 = pdVar4[i + iVar6];
  dVar10 = SQRT(dVar9 * dVar9 + dVar1 * dVar1);
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar9 = dVar9 / dVar10;
    dVar10 = -dVar1 / dVar10;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        iVar2 = this->current_k;
        if (0 < (long)iVar2) {
          lVar7 = 0;
          do {
            dVar1 = pdVar4[iVar6 + lVar7];
            pdVar4[iVar6 + lVar7] = dVar9 * dVar1 + pdVar4[iVar5 + lVar7] * -dVar10;
            pdVar4[iVar5 + lVar7] = dVar1 * dVar10 + pdVar4[iVar5 + lVar7] * dVar9;
            lVar7 = lVar7 + 1;
          } while (iVar2 != lVar7);
        }
      }
      else {
        uVar3 = this->current_k;
        if (dVar10 <= 0.0) {
          if (0 < (int)uVar3) {
            uVar8 = 0;
            do {
              dVar1 = pdVar4[(long)iVar6 + uVar8];
              pdVar4[(long)iVar6 + uVar8] = pdVar4[(long)iVar5 + uVar8];
              pdVar4[(long)iVar5 + uVar8] = -dVar1;
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
          }
        }
        else if (0 < (int)uVar3) {
          uVar8 = 0;
          do {
            dVar1 = pdVar4[(long)iVar6 + uVar8];
            pdVar4[(long)iVar6 + uVar8] = -pdVar4[(long)iVar5 + uVar8];
            pdVar4[(long)iVar5 + uVar8] = dVar1;
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
      }
    }
    else if ((dVar9 <= 0.0) && (iVar2 = this->current_k, 0 < (long)iVar2)) {
      lVar7 = 0;
      do {
        pdVar4[iVar6 + lVar7] = -pdVar4[iVar6 + lVar7];
        pdVar4[iVar5 + lVar7] = -pdVar4[iVar5 + lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
  }
  pdVar4[iVar5 + i] = 0.0;
  return;
}

Assistant:

void eliminate(std::vector<double>& m, HighsInt i, HighsInt j, HighsInt kmax,
                 HighsInt currentk) {
    // i = col, j = row
    if (m[j * kmax + i] == 0.0) {
      return;
    }
    double z = sqrt(m[i * kmax + i] * m[i * kmax + i] +
                    m[j * kmax + i] * m[j * kmax + i]);
    double cos_, sin_;
    if (z == 0) {
      cos_ = 1.0;
      sin_ = 0.0;
    } else {
      cos_ = m[i * kmax + i] / z;
      sin_ = -m[j * kmax + i] / z;
    }

    if (sin_ == 0.0) {
      if (cos_ > 0.0) {
        // nothing
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -a_ik;
          m[j * kmax + k] = -m[j * kmax + k];
        }
      }
    } else if (cos_ == 0.0) {
      if (sin_ > 0.0) {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -m[j * kmax + k];
          m[j * kmax + k] = a_ik;
        }
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = m[j * kmax + k];
          m[j * kmax + k] = -a_ik;
        }
      }
    } else {
      // #pragma omp parallel for
      for (HighsInt k = 0; k < current_k; k++) {
        // update entry i and j of column k
        double a_ik = m[i * kmax + k];
        // entry i
        m[i * kmax + k] = cos_ * a_ik - sin_ * m[j * kmax + k];
        m[j * kmax + k] = sin_ * a_ik + cos_ * m[j * kmax + k];
      }
    }
    m[j * kmax + i] = 0.0;
  }